

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

bool __thiscall ON_CheckSum::IsSet(ON_CheckSum *this)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((((this->m_size == 0) && (this->m_time == 0)) && (this->m_crc[0] == 0)) &&
       ((this->m_crc[1] == 0 && (this->m_crc[2] == 0)))) &&
      ((this->m_crc[3] == 0 && ((this->m_crc[4] == 0 && (this->m_crc[5] == 0)))))) &&
     (this->m_crc[6] == 0)) {
    bVar1 = this->m_crc[7] != 0;
  }
  return bVar1;
}

Assistant:

bool ON_CheckSum::IsSet() const
{
  return ( 0 != m_size 
           || 0 != m_time 
           || 0 != m_crc[0]
           || 0 != m_crc[1]
           || 0 != m_crc[2]
           || 0 != m_crc[3]
           || 0 != m_crc[4]
           || 0 != m_crc[5]
           || 0 != m_crc[6]
           || 0 != m_crc[7]
           );           
}